

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O0

void parse_util::parse_double(string *nums,double *res,string *unit)

{
  char *__nptr;
  string *in_RDX;
  double *in_RSI;
  double dVar1;
  string snum;
  string symb;
  size_type pos;
  string tmp;
  string local_b8 [32];
  string *in_stack_ffffffffffffff68;
  allocator local_61;
  string local_60 [32];
  long local_40;
  string local_38 [32];
  string *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  remove_spaces(in_stack_ffffffffffffff68);
  local_40 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"smnu",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = std::__cxx11::string::find_first_of(local_38,(ulong)local_60);
  if (local_40 == -1) {
    std::__cxx11::string::operator=(local_18,"");
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff68,(ulong)local_38);
    std::__cxx11::string::operator=(local_18,(string *)&stack0xffffffffffffff68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  std::__cxx11::string::substr((ulong)local_b8,(ulong)local_38);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(__nptr);
  *local_10 = dVar1;
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void parse_double(const string &nums, double &res, string &unit)
    {
        string tmp = remove_spaces(nums);
        string::size_type pos = 0;
        string symb = "smnu";

        pos = tmp.find_first_of(symb, pos);

        if (pos != string::npos)
            unit = tmp.substr(pos, tmp.size() - pos);
        else unit = "";

        string snum = tmp.substr(0,pos);
        res = atof(snum.c_str());
    }